

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O2

bool __thiscall RecordType::ByteOrderSensitive(RecordType *this)

{
  int iVar1;
  bool bVar2;
  pointer ppRVar3;
  bool bVar4;
  
  if (this->record_fields_ == (RecordFieldList *)0x0) {
    bVar2 = false;
  }
  else {
    ppRVar3 = (this->record_fields_->
              super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    do {
      bVar4 = ppRVar3 ==
              (this->record_fields_->
              super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
      bVar2 = !bVar4;
      if (bVar4) {
        return bVar2;
      }
      iVar1 = (*((*ppRVar3)->super_Field).super_DataDepElement._vptr_DataDepElement[0xf])();
      ppRVar3 = ppRVar3 + 1;
    } while ((char)iVar1 == '\0');
  }
  return bVar2;
}

Assistant:

bool RecordType::ByteOrderSensitive() const
	{
	foreach (i, RecordFieldList, record_fields_)
		{
		RecordField* f = *i;
		if ( f->RequiresByteOrder() )
			return true;
		}
	return false;
	}